

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_cache.cpp
# Opt level: O0

void __thiscall libtorrent::cached_piece_entry::~cached_piece_entry(cached_piece_entry *this)

{
  cached_piece_entry *this_local;
  
  libtorrent::aux::unique_ptr<libtorrent::cached_block_entry[],_long>::~unique_ptr(&this->blocks);
  std::unique_ptr<libtorrent::partial_hash,_std::default_delete<libtorrent::partial_hash>_>::
  ~unique_ptr(&this->hash);
  std::shared_ptr<libtorrent::storage_interface>::~shared_ptr(&this->storage);
  boost::intrusive::
  list_base_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>::~list_base_hook
            (&this->
              super_list_base_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>
            );
  return;
}

Assistant:

cached_piece_entry::~cached_piece_entry()
{
	TORRENT_ASSERT(piece_refcount == 0);
	TORRENT_ASSERT(jobs.empty());
	TORRENT_ASSERT(read_jobs.empty());
#if TORRENT_USE_ASSERTS
	if (blocks)
	{
		for (int i = 0; i < blocks_in_piece; ++i)
		{
			TORRENT_ASSERT(!blocks[i].pending);
			TORRENT_ASSERT(blocks[i].refcount == 0);
			TORRENT_ASSERT(blocks[i].hashing_count == 0);
			TORRENT_ASSERT(blocks[i].flushing_count == 0);
		}
	}
	in_use = false;
#endif
}